

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_many<(libdivide::Branching)1>(DivideTest<long> *this,long denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong in_RSI;
  DivideTest<long> *in_RDI;
  long recovered;
  divider<long,_(libdivide::Branching)1> the_divider;
  libdivide_s64_t tmp;
  libdivide_s64_branchfree_t ret;
  int64_t magic;
  uint64_t twice_rem;
  uint64_t e;
  uint64_t proposed_m;
  uint64_t rem;
  uint8_t more;
  uint32_t floor_log_2_d;
  uint64_t absD;
  uint64_t ud;
  libdivide_s64_t result;
  uint64_t result_1;
  divider<long,_(libdivide::Branching)1> *in_stack_fffffffffffffe60;
  ostream *poVar5;
  long in_stack_fffffffffffffe68;
  string *psVar6;
  DivideTest<long> *in_stack_fffffffffffffe70;
  ulong denom_00;
  DivideTest<long> *this_00;
  DivideTest<long> *in_stack_fffffffffffffe90;
  string local_160 [32];
  ulong local_140;
  undefined1 local_131 [33];
  DivideTest<long> *local_110;
  long local_108;
  byte bVar7;
  undefined7 in_stack_ffffffffffffff01;
  DivideTest<long> *this_01;
  long local_78;
  DivideTest<long> local_70;
  ulong local_60;
  undefined4 local_4c;
  long local_39;
  byte local_31;
  ulong local_30;
  undefined8 local_28;
  DivideTest<long> *local_20;
  ulong local_18;
  undefined8 local_10;
  ulong local_8;
  
  this_00 = (DivideTest<long> *)local_131;
  local_4c = 1;
  local_110 = this_00;
  if (in_RSI == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x658,"libdivide_internal_s64_gen",
            "divider must be != 0");
    abort();
  }
  denom_00 = in_RSI;
  if ((long)in_RSI < 0) {
    denom_00 = -in_RSI;
  }
  local_70.rand_n._4_4_ = 0x3f - (int)LZCOUNT(denom_00);
  local_31 = (byte)local_70.rand_n._4_4_;
  if ((denom_00 & denom_00 - 1) == 0) {
    local_39 = 0;
    bVar7 = 0;
    if ((long)in_RSI < 0) {
      bVar7 = 0x80;
    }
    local_31 = local_31 | bVar7;
  }
  else {
    local_8 = 1L << (local_31 - 1 & 0x3f);
    local_10 = 0;
    in_stack_fffffffffffffe70 = &local_70;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = denom_00;
    local_28 = 0;
    uVar4 = SUB168((auVar2 << 0x40) % auVar1,0);
    local_78 = 0;
    uVar3 = uVar4 * 2;
    if ((denom_00 <= uVar3) || (uVar3 < uVar4)) {
      local_78 = 1;
    }
    local_70.rand_n._3_1_ = local_31 | 0x40;
    local_39 = local_78 + 1;
    if ((long)in_RSI < 0) {
      local_70.rand_n._3_1_ = local_31 | 0xc0;
    }
    local_31 = local_70.rand_n._3_1_;
    local_20 = in_stack_fffffffffffffe70;
    local_18 = denom_00;
  }
  local_108 = local_39;
  local_131._0_8_ = local_39;
  local_131[8] = local_31;
  local_131._9_8_ = in_RSI;
  bVar7 = local_31;
  this_01 = this_00;
  local_60 = denom_00;
  local_30 = denom_00;
  local_140 = libdivide::divider<long,_(libdivide::Branching)1>::recover
                        ((divider<long,_(libdivide::Branching)1> *)local_131);
  if (local_140 != local_131._9_8_) {
    poVar5 = (ostream *)&std::cerr;
    std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
    psVar6 = local_160;
    testcase_name_abi_cxx11_(this_00,(int)((ulong)in_RDI >> 0x20));
    std::operator<<(poVar5,psVar6);
    std::__cxx11::string::~string(local_160);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,local_131._9_8_);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,local_140);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  test_edgecase_numerators<(libdivide::Branching)1>
            (in_stack_fffffffffffffe90,(long)this_00,
             (divider<long,_(libdivide::Branching)1> *)in_RDI);
  test_small_numerators<(libdivide::Branching)1>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  test_pow2_numerators<(libdivide::Branching)1>
            (in_RDI,denom_00,(divider<long,_(libdivide::Branching)1> *)in_stack_fffffffffffffe70);
  test_allbits_numerators<(libdivide::Branching)1>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  test_random_numerators<(libdivide::Branching)1>
            (in_RDI,denom_00,(divider<long,_(libdivide::Branching)1> *)in_stack_fffffffffffffe70);
  test_vectordivide_numerators<(libdivide::Branching)1>
            (this_01,in_RSI,
             (divider<long,_(libdivide::Branching)1> *)CONCAT71(in_stack_ffffffffffffff01,bVar7));
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }